

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

subiter_type * __thiscall
gnuplotio::
VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>
::deref_subiter(subiter_type *__return_storage_ptr__,
               VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>
               *this)

{
  size_type sVar1;
  const_reference this_00;
  reference pvVar2;
  subiter_type sVar3;
  ulong local_50;
  size_t i;
  allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
  local_31;
  undefined1 local_30 [8];
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  subvec;
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>
  *this_local;
  
  subvec.
  super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  sVar1 = std::
          vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::size(&this->rvec);
  std::
  allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
  ::allocator(&local_31);
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  ::vector((vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
            *)local_30,sVar1,&local_31);
  std::
  allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
  ::~allocator(&local_31);
  local_50 = 0;
  while( true ) {
    sVar1 = std::
            vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::size(&this->rvec);
    if (sVar1 <= local_50) break;
    this_00 = std::
              vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->rvec,local_50);
    sVar3 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
            ::deref_subiter(this_00);
    pvVar2 = std::
             vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
             ::operator[]((vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
                           *)local_30,local_50);
    pvVar2->it = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 sVar3.it._M_current;
    pvVar2->end = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                  sVar3.end._M_current;
    local_50 = local_50 + 1;
  }
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
  ::VecOfRange(__return_storage_ptr__,
               (vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
                *)local_30);
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  ::~vector((vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

subiter_type deref_subiter() const {
        std::vector<typename RT::subiter_type> subvec(rvec.size());
        for(size_t i=0; i<rvec.size(); i++) {
            subvec[i] = rvec[i].deref_subiter();
        }
        return subiter_type(subvec);
    }